

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Wire.cpp
# Opt level: O2

vector<CWire_*,_std::allocator<CWire_*>_> * __thiscall
CWire::AdjustByBoundary
          (vector<CWire_*,_std::allocator<CWire_*>_> *__return_storage_ptr__,CWire *this)

{
  uint *puVar1;
  char cVar2;
  short sVar3;
  short sVar4;
  CPoint *pCVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  CLayer *this_00;
  void *__s;
  CLayer *pCVar9;
  CBoundary *pCVar10;
  CWire *pCVar11;
  uint uVar12;
  int iVar13;
  uint uVar14;
  CDesign *this_01;
  ulong uVar15;
  ulong uVar16;
  CWire *pWire;
  ulong local_40;
  CNet *local_38;
  
  uVar14 = (this->super_CObject).m_iState;
  if ((uVar14 & 1) == 0) {
    __assert_fail("IsRouted()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/Wire.cpp"
                  ,0x16e,"vector<CWire *> CWire::AdjustByBoundary()");
  }
  if ((uVar14 & 4) == 0) {
    __assert_fail("IsLayerAssigned()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/Wire.cpp"
                  ,0x16f,"vector<CWire *> CWire::AdjustByBoundary()");
  }
  (__return_storage_ptr__->super__Vector_base<CWire_*,_std::allocator<CWire_*>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<CWire_*,_std::allocator<CWire_*>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<CWire_*,_std::allocator<CWire_*>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar6 = GetLength(this);
  std::vector<CWire_*,_std::allocator<CWire_*>_>::reserve(__return_storage_ptr__,(long)iVar6);
  this_00 = GetLayer(this);
  this_01 = CObject::m_pDesign;
  if (this_00 == (CLayer *)0x0) {
    __assert_fail("pLayer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/Wire.cpp"
                  ,0x175,"vector<CWire *> CWire::AdjustByBoundary()");
  }
  local_38 = (CNet *)(this->super_CObject).m_pParent;
  if (local_38 != (CNet *)0x0) {
    uVar14 = (this->super_CObject).m_iProp;
    if ((uVar14 & 5) == 0) {
      if ((uVar14 & 10) == 0) {
        if ((uVar14 >> 9 & 1) != 0) {
          pWire = this;
          std::vector<CWire*,std::allocator<CWire*>>::emplace_back<CWire*>
                    ((vector<CWire*,std::allocator<CWire*>> *)__return_storage_ptr__,&pWire);
          return __return_storage_ptr__;
        }
        __assert_fail("IsPoint()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/Wire.cpp"
                      ,0x21c,"vector<CWire *> CWire::AdjustByBoundary()");
      }
      iVar13 = (int)this->m_pPointE->m_iY;
      iVar6 = (int)this->m_pPointS->m_iY;
      uVar14 = iVar13 - iVar6;
      if (uVar14 == 0 || iVar13 < iVar6) {
        __assert_fail("iNumBoundary>0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/Wire.cpp"
                      ,0x1cd,"vector<CWire *> CWire::AdjustByBoundary()");
      }
      uVar15 = (ulong)uVar14;
      __s = operator_new__(uVar15 * 4 + 4);
      memset(__s,0,uVar15 * 4);
      *(undefined4 *)((long)__s + uVar15 * 4) = 1;
      uVar12 = 0;
      local_40 = uVar15;
      for (uVar16 = 0; uVar16 != local_40; uVar16 = uVar16 + 1) {
        for (iVar6 = 1;
            iVar6 <= (int)(CObject::m_pDesign->super_CBBox).m_cMaxZ -
                     (int)(CObject::m_pDesign->super_CBBox).m_cMinZ; iVar6 = iVar6 + 1) {
          pCVar9 = CDesign::GetLayer(CObject::m_pDesign,iVar6);
          iVar13 = CLayer::GetDirection(pCVar9);
          iVar7 = CLayer::GetDirection(this_00);
          if (iVar13 == iVar7) {
            pCVar10 = CLayer::GetBoundary(pCVar9,(int)this->m_pPointS->m_iX,
                                          (int)this->m_pPointS->m_iY + (int)uVar16);
            uVar8 = CBoundary::IsFound(pCVar10,local_38);
            puVar1 = (uint *)((long)__s + uVar16 * 4);
            *puVar1 = *puVar1 | uVar8;
          }
        }
        uVar12 = uVar12 + *(int *)((long)__s + uVar16 * 4);
      }
      if (uVar12 == 0) {
        pWire = this;
        std::vector<CWire*,std::allocator<CWire*>>::emplace_back<CWire*>
                  ((vector<CWire*,std::allocator<CWire*>> *)__return_storage_ptr__,&pWire);
      }
      else if (uVar12 == uVar14) {
        if ((__return_storage_ptr__->super__Vector_base<CWire_*,_std::allocator<CWire_*>_>)._M_impl.
            super__Vector_impl_data._M_start !=
            (__return_storage_ptr__->super__Vector_base<CWire_*,_std::allocator<CWire_*>_>)._M_impl.
            super__Vector_impl_data._M_finish) {
          __assert_fail("AdjWire.empty()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/Wire.cpp"
                        ,0x1ec,"vector<CWire *> CWire::AdjustByBoundary()");
        }
        (this->super_CObject).m_pParent = (CObject *)0x0;
        Delete(this);
      }
      else {
        pCVar5 = this->m_pPointS;
        sVar3 = pCVar5->m_iY;
        sVar4 = pCVar5->m_iX;
        cVar2 = pCVar5->m_cZ;
        uVar16 = 0xffffffffffffffff;
        for (uVar15 = 0; uVar15 <= local_40; uVar15 = uVar15 + 1) {
          iVar6 = (int)uVar16;
          if (*(int *)((long)__s + uVar15 * 4) == 0) {
            uVar16 = uVar16 & 0xffffffff;
            if (iVar6 < 0) {
              uVar16 = uVar15 & 0xffffffff;
            }
          }
          else if (-1 < iVar6) {
            if (uVar15 <= (uVar16 & 0xffffffff)) {
              __assert_fail("iNSY<iNEY",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/Wire.cpp"
                            ,0x204,"vector<CWire *> CWire::AdjustByBoundary()");
            }
            pCVar11 = (CWire *)operator_new(0x50);
            CWire(pCVar11);
            pWire = pCVar11;
            (*(pCVar11->super_CObject)._vptr_CObject[3])
                      (pCVar11,(ulong)(uint)(int)sVar4,(ulong)(uint)(iVar6 + sVar3),
                       (ulong)(uint)(int)sVar4,(ulong)(uint)((int)sVar3 + (int)uVar15),
                       (ulong)(uint)(int)cVar2,this);
            std::vector<CWire_*,_std::allocator<CWire_*>_>::push_back(__return_storage_ptr__,&pWire)
            ;
            uVar16 = 0xffffffffffffffff;
          }
        }
        (this->super_CObject).m_pParent = (CObject *)0x0;
        Delete(this);
      }
    }
    else {
      iVar13 = (int)this->m_pPointE->m_iX;
      iVar6 = (int)this->m_pPointS->m_iX;
      uVar14 = iVar13 - iVar6;
      if ((uVar14 == 0 || iVar13 < iVar6) ||
         (((int)(CObject::m_pDesign->super_CBBox).m_iMaxX -
           (int)(CObject::m_pDesign->super_CBBox).m_iMinX < (int)uVar14 &&
          ((int)(CObject::m_pDesign->super_CBBox).m_iMaxY -
           (int)(CObject::m_pDesign->super_CBBox).m_iMinY < (int)uVar14)))) {
        __assert_fail("iNumBoundary>0&&(iNumBoundary<=GetDesign()->W()||iNumBoundary<=GetDesign()->H())"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/Wire.cpp"
                      ,0x17d,"vector<CWire *> CWire::AdjustByBoundary()");
      }
      uVar16 = (ulong)uVar14;
      __s = operator_new__(uVar16 * 4 + 4);
      memset(__s,0,uVar16 * 4);
      *(undefined4 *)((long)__s + uVar16 * 4) = 1;
      uVar12 = 0;
      local_40 = uVar16;
      for (uVar15 = 0; uVar15 != local_40; uVar15 = uVar15 + 1) {
        for (iVar6 = 1;
            iVar6 <= (int)(this_01->super_CBBox).m_cMaxZ - (int)(this_01->super_CBBox).m_cMinZ;
            iVar6 = iVar6 + 1) {
          pCVar9 = CDesign::GetLayer(this_01,iVar6);
          iVar13 = CLayer::GetDirection(pCVar9);
          iVar7 = CLayer::GetDirection(this_00);
          if (iVar13 == iVar7) {
            pCVar10 = CLayer::GetBoundary(pCVar9,(int)this->m_pPointS->m_iX + (int)uVar15,
                                          (int)this->m_pPointS->m_iY);
            uVar8 = CBoundary::IsFound(pCVar10,local_38);
            puVar1 = (uint *)((long)__s + uVar15 * 4);
            *puVar1 = *puVar1 | uVar8;
          }
          this_01 = CObject::m_pDesign;
        }
        uVar12 = uVar12 + *(int *)((long)__s + uVar15 * 4);
      }
      if (uVar12 == 0) {
        pWire = this;
        std::vector<CWire*,std::allocator<CWire*>>::emplace_back<CWire*>
                  ((vector<CWire*,std::allocator<CWire*>> *)__return_storage_ptr__,&pWire);
      }
      else if (uVar12 == uVar14) {
        if ((__return_storage_ptr__->super__Vector_base<CWire_*,_std::allocator<CWire_*>_>)._M_impl.
            super__Vector_impl_data._M_start !=
            (__return_storage_ptr__->super__Vector_base<CWire_*,_std::allocator<CWire_*>_>)._M_impl.
            super__Vector_impl_data._M_finish) {
          __assert_fail("AdjWire.empty()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/Wire.cpp"
                        ,0x19e,"vector<CWire *> CWire::AdjustByBoundary()");
        }
        (this->super_CObject).m_pParent = (CObject *)0x0;
        Delete(this);
      }
      else {
        pCVar5 = this->m_pPointS;
        sVar3 = pCVar5->m_iX;
        sVar4 = pCVar5->m_iY;
        cVar2 = pCVar5->m_cZ;
        uVar16 = 0xffffffffffffffff;
        for (uVar15 = 0; uVar15 <= local_40; uVar15 = uVar15 + 1) {
          iVar6 = (int)uVar16;
          if (*(int *)((long)__s + uVar15 * 4) == 0) {
            uVar16 = uVar16 & 0xffffffff;
            if (iVar6 < 0) {
              uVar16 = uVar15 & 0xffffffff;
            }
          }
          else if (-1 < iVar6) {
            pCVar11 = (CWire *)operator_new(0x50);
            CWire(pCVar11);
            pWire = pCVar11;
            (*(pCVar11->super_CObject)._vptr_CObject[3])
                      (pCVar11,(ulong)(uint)(iVar6 + sVar3),(ulong)(uint)(int)sVar4,
                       (ulong)(uint)((int)sVar3 + (int)uVar15),(ulong)(uint)(int)sVar4,
                       (ulong)(uint)(int)cVar2,this);
            std::vector<CWire_*,_std::allocator<CWire_*>_>::push_back(__return_storage_ptr__,&pWire)
            ;
            uVar16 = 0xffffffffffffffff;
          }
        }
        (this->super_CObject).m_pParent = (CObject *)0x0;
        Delete(this);
      }
    }
    operator_delete__(__s);
    return __return_storage_ptr__;
  }
  __assert_fail("pNet",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/Wire.cpp"
                ,0x177,"vector<CWire *> CWire::AdjustByBoundary()");
}

Assistant:

vector<CWire*> CWire::AdjustByBoundary()
{
	assert(IsRouted());
	assert(IsLayerAssigned());

	vector<CWire*>		AdjWire;
	AdjWire.reserve(GetLength());

	CLayer*	pLayer		=	GetLayer();
	assert(pLayer);
	CNet*	pNet		=	GetParent();
	assert(pNet);

	int	iNumBoundary	=	0;
	if(IsHorizontal())
	{
		iNumBoundary			=	m_pPointE->X()-m_pPointS->X();
		assert(iNumBoundary>0&&(iNumBoundary<=GetDesign()->W()||iNumBoundary<=GetDesign()->H()));

		int*	pBoundary		=	new	int[iNumBoundary+1];
		assert(pBoundary);

		memset(pBoundary,0x00,iNumBoundary*sizeof(int));
		pBoundary[iNumBoundary]	=	1;	// mark as the last element [7/5/2006 thyeros]

		int	iSum	=	0;
		int	i,j;
		for (i=0;i<iNumBoundary;++i)
		{
			for (j=1;j<=GetDesign()->T();++j)
			{
				CLayer*	pCurLayer	=	GetDesign()->GetLayer(j);

				if(pCurLayer->GetDirection()==pLayer->GetDirection())
				{
					pBoundary[i]	|=	pCurLayer->GetBoundary(i+m_pPointS->X(),m_pPointS->Y())->IsFound(pNet);	
				}
			}

			iSum	+=	pBoundary[i];
		}

		if(iSum==0)
		{	
			// whole wire is needed [7/5/2006 thyeros]
			AdjWire.push_back(this);
		}
		else if(iSum==iNumBoundary)
		{
			// already wires are there, discard this wire [7/5/2006 thyeros]
			assert(AdjWire.empty());

			m_pParent	=	NULL;
			Delete();//delete	this;
		}
		else
		{
			// partially needed [7/5/2006 thyeros]
			int	iSX		=	m_pPointS->X();
			int	iEX		=	m_pPointE->X();
			int	iY		=	m_pPointS->Y();
			int	iZ		=	m_pPointS->Z();

			int	iLast	=	-1;
			for (i=0;i<iNumBoundary+1;++i)
			{
				if(pBoundary[i])
				{
					if(iLast>=0)
					{
						// create wire between iLast and i [7/5/2006 thyeros]
						int	iNSX	=	iSX+iLast;
						int	iNEX	=	iSX+i;
						
						CWire*	pWire	=	new CWire;
						pWire->Initialize(iNSX,iY,iNEX,iY,iZ,this);
						
						AdjWire.push_back(pWire);
						
						iLast	=	-1;
					}
				}
				else
				{
					if(iLast<0)		iLast	=	i;
				}
			}

			m_pParent	=	NULL;
			Delete();//delete	this;
		}

		SAFE_DELA(pBoundary);
	}
	else if(IsVertical())
	{
		iNumBoundary	=	m_pPointE->Y()-m_pPointS->Y();
		assert(iNumBoundary>0);

		int*	pBoundary		=	new	int[iNumBoundary+1];
		memset(pBoundary,0x00,iNumBoundary*sizeof(int));
		pBoundary[iNumBoundary]	=	1;	// mark as the last element [7/5/2006 thyeros]
		assert(pBoundary);

		int	iSum	=	0;
		int	i,j;
		for (i=0;i<iNumBoundary;++i)
		{
			for (j=1;j<=GetDesign()->T();++j)
			{
				CLayer*	pCurLayer	=	GetDesign()->GetLayer(j);

				if(pCurLayer->GetDirection()==pLayer->GetDirection())
				{
					pBoundary[i]	|=	pCurLayer->GetBoundary(m_pPointS->X(),i+m_pPointS->Y())->IsFound(pNet);	
				}
			}
			iSum	+=	pBoundary[i];
		}

		if(iSum==0)
		{	
			// whole wire is needed [7/5/2006 thyeros]
			AdjWire.push_back(this);
		}
		else if(iSum==iNumBoundary)
		{
			// already wires are there, discard this wire [7/5/2006 thyeros]
			assert(AdjWire.empty());

			m_pParent	=	NULL;
			Delete();//delete	this;
		}
		else
		{
			// partially needed [7/5/2006 thyeros]
			int	iSY		=	m_pPointS->Y();
			int	iEY		=	m_pPointE->Y();
			int	iX		=	m_pPointS->X();
			int	iZ		=	m_pPointS->Z();

			int	iLast	=	-1;
			for (i=0;i<iNumBoundary+1;++i)
			{
				if(pBoundary[i])
				{
					if(iLast>=0)
					{
						// create wire between iLast and i [7/5/2006 thyeros]
						int	iNSY	=	iSY+iLast;
						int	iNEY	=	iSY+i;
						
						assert(iNSY<iNEY);
						
						CWire*	pWire	=	new CWire;
						pWire->Initialize(iX,iNSY,iX,iNEY,iZ,this);
						
						AdjWire.push_back(pWire);
						
						iLast	=	-1;	
					}				
				}
				else
				{
					if(iLast<0)		iLast	=	i;
				}
			}

			m_pParent	=	NULL;
			Delete();//delete	this;
		}

		SAFE_DELA(pBoundary);
	}
	else
	{
		assert(IsPoint());
		AdjWire.push_back(this);
	}

	return	AdjWire;
}